

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_compare(sexp ctx,sexp a,sexp b)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  sexp_uint_t sVar9;
  ulong uVar10;
  sexp_sint_t sVar11;
  int iVar12;
  sexp self;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  double g;
  double f;
  sexp r;
  int bt;
  int at;
  sexp in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar13;
  sexp in_stack_ffffffffffffff90;
  sexp in_stack_ffffffffffffff98;
  sexp in_stack_ffffffffffffffa0;
  sexp ctx_00;
  sexp local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uVar14;
  
  uVar6 = sexp_number_type((sexp)in_RSI);
  uVar7 = sexp_number_type((sexp)in_RDX);
  uVar14 = 5.36555291383594e-321;
  local_40 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffb0,0,0x10);
  ctx_00 = (sexp)&local_40;
  uVar1 = *(undefined8 *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffb0;
  if ((int)uVar7 < (int)uVar6) {
    uVar14 = sexp_compare((sexp)in_RSI,(sexp)in_RDX,(sexp)CONCAT44(uVar6,uVar7));
    if (((uVar14 & 3) != 0) || (((sexp)uVar14)->tag != 0x13)) {
      if (((uVar14 & 3) == 0) && (((sexp)uVar14)->tag == 0xb)) {
        (((sexp)uVar14)->value).stack.length =
             (((sexp)uVar14)->value).stack.length ^ 0x8000000000000000;
      }
      else if (((uVar14 & 3) == 0) && (((sexp)uVar14)->tag == 0xc)) {
        (((sexp)uVar14)->value).flonum_bits[0] = -(((sexp)uVar14)->value).flonum_bits[0];
      }
      else if ((uVar14 & 1) == 1) {
        auVar2._8_8_ = (long)uVar14 >> 0x3f;
        auVar2._0_8_ = uVar14 & 0xfffffffffffffffe;
        uVar14 = SUB168(auVar2 / SEXT816(2),0) * -2 | 1;
      }
    }
  }
  else {
    self = (sexp)(ulong)(uint)(uVar7 + uVar6 * 6);
    switch(self) {
    case (sexp)0x0:
    case (sexp)0x1:
    case (sexp)0x2:
    case (sexp)0x3:
    case (sexp)0xb:
    case (sexp)0x11:
    case (sexp)0x17:
    case (sexp)0x1d:
    case (sexp)0x23:
      uVar14 = sexp_type_exception(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                   (sexp_uint_t)in_stack_ffffffffffffff90,
                                   (sexp)CONCAT44(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88));
      break;
    default:
      uVar14 = sexp_xtype_exception
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                          (char *)in_stack_ffffffffffffff90,
                          (sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      break;
    case (sexp)0x7:
      auVar3._8_8_ = (long)in_RSI >> 0x3f;
      auVar3._0_8_ = in_RSI & 0xfffffffffffffffe;
      auVar4._8_8_ = (long)in_RDX >> 0x3f;
      auVar4._0_8_ = in_RDX & 0xfffffffffffffffe;
      uVar14 = (SUB168(auVar3 / SEXT816(2),0) - SUB168(auVar4 / SEXT816(2),0)) * 2 | 1;
      break;
    case (sexp)0x8:
      iVar12 = 1;
      if ((long)(((sexp)in_RDX)->value).flonum < 0) {
        iVar12 = -1;
      }
      iVar8 = 0;
      if (ABS((((sexp)in_RDX)->value).flonum) == INFINITY) {
        iVar8 = iVar12;
      }
      if (iVar8 == 0) {
        if (NAN((((sexp)in_RDX)->value).flonum)) {
          uVar14 = sexp_xtype_exception
                             (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                              (char *)in_stack_ffffffffffffff90,
                              (sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        }
        else {
          local_40 = sexp_inexact_to_exact
                               (ctx_00,self,(sexp_sint_t)in_stack_ffffffffffffffa0,(sexp)in_RSI);
          uVar14 = sexp_compare((sexp)in_RSI,(sexp)in_RDX,(sexp)CONCAT44(uVar6,uVar7));
        }
      }
      else {
        uVar14 = &DAT_00000003;
        if (0.0 < (((sexp)in_RDX)->value).flonum) {
          uVar14 = (sexp)0xffffffffffffffff;
        }
      }
      break;
    case (sexp)0x9:
      sVar9 = sexp_bignum_hi((sexp)in_RDX);
      if ((sVar9 < 2) && ((((sexp)in_RDX)->value).type.slots < (sexp)0x4000000000000000)) {
        auVar5._8_8_ = (long)in_RSI >> 0x3f;
        auVar5._0_8_ = in_RSI & 0xfffffffffffffffe;
        uVar10 = (SUB168(auVar5 / SEXT816(2),0) - (((sexp)in_RDX)->value).uvector.length) * 2;
      }
      else {
        iVar12 = -1;
        if ((((sexp)in_RDX)->value).flonum_bits[0] < '\0') {
          iVar12 = 1;
        }
        uVar10 = (long)iVar12 << 1;
      }
      uVar14 = uVar10 | 1;
      break;
    case (sexp)0xa:
    case (sexp)0x16:
      local_40 = sexp_make_ratio(in_stack_ffffffffffffff90,
                                 (sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                                 ,in_stack_ffffffffffffff80);
    case (sexp)0x1c:
      uVar14 = sexp_ratio_compare(ctx_00,self,in_stack_ffffffffffffffa0);
      break;
    case (sexp)0xe:
      local_30 = (((sexp)in_RSI)->value).flonum;
      local_38 = (((sexp)in_RDX)->value).flonum;
      if (NAN((double)local_30)) {
        uVar14 = sexp_xtype_exception
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                            (char *)in_stack_ffffffffffffff90,
                            (sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
      else if (NAN((double)local_38)) {
        uVar14 = sexp_xtype_exception
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                            (char *)in_stack_ffffffffffffff90,
                            (sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
      else {
        if ((double)local_38 <= (double)local_30) {
          uVar13 = (uint)((double)local_30 != (double)local_38);
        }
        else {
          uVar13 = 0xffffffff;
        }
        uVar14 = (long)(int)uVar13 << 1 | 1;
      }
      break;
    case (sexp)0xf:
      local_30 = (((sexp)in_RSI)->value).flonum;
      iVar12 = 1;
      if ((long)local_30 < 0) {
        iVar12 = -1;
      }
      iVar8 = 0;
      if (ABS((double)local_30) == INFINITY) {
        iVar8 = iVar12;
      }
      if (iVar8 != 0) {
        uVar14 = (sexp)0xffffffffffffffff;
        if (0.0 < (double)local_30) {
          uVar14 = &DAT_00000003;
        }
        break;
      }
      if (NAN((double)local_30)) {
        uVar14 = sexp_xtype_exception
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                            (char *)in_stack_ffffffffffffff90,
                            (sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        break;
      }
      local_40 = sexp_double_to_bignum((sexp)CONCAT44(uVar6,uVar7),(double)uVar14);
    case (sexp)0x15:
      sVar11 = sexp_bignum_compare((sexp)CONCAT44(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88),
                                   in_stack_ffffffffffffff80);
      uVar14 = sVar11 << 1 | 1;
      break;
    case (sexp)0x10:
      local_30 = (((sexp)in_RSI)->value).flonum;
      iVar12 = 1;
      if ((long)local_30 < 0) {
        iVar12 = -1;
      }
      iVar8 = 0;
      if (ABS((double)local_30) == INFINITY) {
        iVar8 = iVar12;
      }
      if (iVar8 == 0) {
        if (NAN((double)local_30)) {
          uVar14 = sexp_xtype_exception
                             (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                              (char *)in_stack_ffffffffffffff90,
                              (sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        }
        else {
          local_40 = sexp_inexact_to_exact
                               (ctx_00,self,(sexp_sint_t)in_stack_ffffffffffffffa0,
                                in_stack_ffffffffffffff98);
          uVar14 = sexp_compare((sexp)in_RSI,(sexp)in_RDX,(sexp)CONCAT44(uVar6,uVar7));
        }
      }
      else {
        uVar14 = (sexp)0xffffffffffffffff;
        if (0.0 < (double)local_30) {
          uVar14 = &DAT_00000003;
        }
      }
    }
  }
  *(undefined8 *)(in_RDI + 0x6080) = uVar1;
  return (sexp)uVar14;
}

Assistant:

sexp sexp_compare (sexp ctx, sexp a, sexp b) {
  int at=sexp_number_type(a), bt=sexp_number_type(b);
  sexp r=SEXP_VOID;
  double f, g;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {
    r = sexp_compare(ctx, b, a);
    if (!sexp_exceptionp(r)) { sexp_negate(r); }
  } else {
    switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
    case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
    case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_COMPLEX
    case SEXP_NUM_CPX_CPX: case SEXP_NUM_FIX_CPX:
    case SEXP_NUM_FLO_CPX: case SEXP_NUM_BIG_CPX:
#if SEXP_USE_RATIOS
    case SEXP_NUM_RAT_CPX:
#endif
#endif
      r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
      break;
    case SEXP_NUM_FIX_FIX:
      r = sexp_make_fixnum(sexp_unbox_fixnum(a) - sexp_unbox_fixnum(b));
      break;
    case SEXP_NUM_FIX_FLO:
      if (isinf(sexp_flonum_value(b))) {
        r = sexp_flonum_value(b) > 0 ? SEXP_NEG_ONE : SEXP_ONE;
      } else if (isnan(sexp_flonum_value(b))) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", b);
      } else {
        r = sexp_compare(ctx, a, tmp=sexp_inexact_to_exact(ctx, NULL, 1, b));
      }
      break;
    case SEXP_NUM_FIX_BIG:
      if ((sexp_bignum_hi(b) > 1) ||
          (sexp_bignum_data(b)[0] > SEXP_MAX_FIXNUM))
        r = sexp_make_fixnum(sexp_bignum_sign(b) < 0 ? 1 : -1);
      else
        r = sexp_make_fixnum(sexp_unbox_fixnum(a) - (sexp_sint_t)sexp_bignum_data(b)[0]);
      break;
    case SEXP_NUM_FLO_FLO:
      f = sexp_flonum_value(a);
      g = sexp_flonum_value(b);
      if (isnan(f))
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
      else if (isnan(g))
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", b);
      else
        r = sexp_make_fixnum(f < g ? -1 : f == g ? 0 : 1);
      break;
    case SEXP_NUM_FLO_BIG:
      f = sexp_flonum_value(a);
      if (isinf(f)) {
        r = f > 0 ? SEXP_ONE : SEXP_NEG_ONE;
        break;
      } else if (isnan(f)) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
        break;
      } else {
        a = tmp = sexp_double_to_bignum(ctx, f);
      }
      /* ... FALLTHROUGH ... */
    case SEXP_NUM_BIG_BIG:
      r = sexp_make_fixnum(sexp_bignum_compare(a, b));
      break;
#if SEXP_USE_RATIOS
    case SEXP_NUM_FLO_RAT:
      f = sexp_flonum_value(a);
      if (isinf(f)) {
        r = f > 0 ? SEXP_ONE : SEXP_NEG_ONE;
      } else if (isnan(f)) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
      } else {
        r = sexp_compare(ctx, tmp=sexp_inexact_to_exact(ctx, NULL, 1, a), b);
      }
      break;
    case SEXP_NUM_FIX_RAT:
    case SEXP_NUM_BIG_RAT:
      a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
      /* ... FALLTHROUGH ... */
    case SEXP_NUM_RAT_RAT:
      r = sexp_ratio_compare(ctx, a, b);
      break;
#endif
    default:
      r = sexp_xtype_exception(ctx, NULL, "unknown comparison", a);
      break;
    }
  }
  sexp_gc_release1(ctx);
  return r;
}